

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O0

void __thiscall
QHttpNetworkConnectionChannel::resendCurrentRequest(QHttpNetworkConnectionChannel *this)

{
  QHttpNetworkConnection *pQVar1;
  long in_RDI;
  QHttpNetworkConnectionChannel *unaff_retaddr;
  QObject *in_stack_00000008;
  long lVar2;
  ConnectionType c;
  
  lVar2 = in_RDI;
  requeueCurrentlyPipelinedRequests(unaff_retaddr);
  c = (ConnectionType)((ulong)lVar2 >> 0x20);
  if (*(long *)(in_RDI + 0x38) != 0) {
    *(undefined1 *)(in_RDI + 0x50) = 1;
  }
  QPointer::operator_cast_to_QHttpNetworkConnection_((QPointer<QHttpNetworkConnection> *)0x2fb5d2);
  pQVar1 = qobject_cast<QHttpNetworkConnection*>((QObject *)0x2fb5da);
  if (pQVar1 != (QHttpNetworkConnection *)0x0) {
    QPointer::operator_cast_to_QHttpNetworkConnection_((QPointer<QHttpNetworkConnection> *)0x2fb5f1)
    ;
    QMetaObject::invokeMethod<>(in_stack_00000008,(char *)unaff_retaddr,c);
  }
  return;
}

Assistant:

void QHttpNetworkConnectionChannel::resendCurrentRequest()
{
    requeueCurrentlyPipelinedRequests();
    if (reply)
        resendCurrent = true;
    if (qobject_cast<QHttpNetworkConnection*>(connection))
        QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
}